

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O3

void Assimp::STEP::ReadFile
               (DB *db,ConversionSchema *scheme,char **types_to_track,size_t len,
               char **inverse_indices_to_track,size_t len2)

{
  char cVar1;
  StreamReaderLE *pSVar2;
  pointer pcVar3;
  char *type_00;
  bool bVar4;
  int iVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  ulong uVar7;
  uint64_t uVar8;
  ulong uVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  Logger *pLVar12;
  const_iterator cVar13;
  char *args;
  LazyObject *this;
  ulong uVar14;
  _Rb_tree_header *p_Var15;
  size_type sVar16;
  ulong extraout_RDX;
  _Alloc_hider _Var17;
  byte bVar18;
  undefined8 uVar19;
  char cVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  string s;
  string type;
  string local_268;
  string local_248;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  ulong local_220;
  long local_218 [2];
  LineSplitter *local_208;
  uint64_t local_200;
  ulong local_1f8;
  uint64_t local_1f0;
  int local_1e4;
  _Rb_tree_header *local_1e0;
  string local_1d8;
  string local_1b8 [3];
  ios_base local_148 [264];
  _Base_ptr local_40;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  *local_38;
  
  db->schema = scheme;
  DB::SetTypesToTrack(db,types_to_track,len);
  DB::SetInverseIndicesToTrack(db,inverse_indices_to_track,len2);
  local_208 = &db->splitter;
  local_1e0 = &(db->objects)._M_t._M_impl.super__Rb_tree_header;
  local_40 = &(scheme->converters)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_38 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
              *)scheme;
  do {
    pSVar2 = (db->splitter).mStream;
    iVar5 = (int)pSVar2->end - (int)pSVar2->current;
    if (iVar5 == 0) goto LAB_006800b4;
    pcVar3 = (db->splitter).mCur._M_dataplus._M_p;
    local_228._M_current = (char *)local_218;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,pcVar3,pcVar3 + (db->splitter).mCur._M_string_length);
    local_1e4 = std::__cxx11::string::compare((char *)&local_228);
    if (local_1e4 == 0) goto LAB_00680080;
    local_1b8[0]._M_dataplus._M_p._0_1_ = 0x20;
    _Var6 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_228,local_228._M_current + local_220,
                       (_Iter_equals_val<const_char>)local_1b8);
    local_220 = (long)_Var6._M_current - (long)local_228._M_current;
    *_Var6._M_current = '\0';
    if (local_220 == 0) goto LAB_006801ef;
    local_200 = local_208->mIdx + 1;
    if (*local_228._M_current == '#') {
      uVar7 = std::__cxx11::string::find((char)&local_228,0x3d);
      if (uVar7 == 0xffffffffffffffff) {
        pLVar12 = DefaultLogger::get();
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"expected token \'=\'","");
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
        AddLineNumber(local_1b8,&local_268,local_200,&local_248);
        Logger::warn(pLVar12,local_1b8[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p,
                          local_1b8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        LineSplitter::operator++(local_208);
      }
      else {
        std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_228);
        uVar8 = strtoul10_64(local_1b8[0]._M_dataplus._M_p,(char **)0x0,(uint *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p,
                          local_1b8[0].field_2._M_allocated_capacity + 1);
        }
        if (uVar8 == 0) {
          pLVar12 = DefaultLogger::get();
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_268,"expected positive, numeric entity id","");
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
          AddLineNumber(local_1b8,&local_268,local_200,&local_248);
          Logger::warn(pLVar12,local_1b8[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
            operator_delete(local_1b8[0]._M_dataplus._M_p,
                            local_1b8[0].field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          LineSplitter::operator++(local_208);
        }
        else {
          uVar9 = std::__cxx11::string::find((char)&local_228,0x28);
          bVar22 = uVar9 == 0xffffffffffffffff;
          local_1f0 = uVar8;
          if (bVar22) {
            LineSplitter::operator++(local_208);
            uVar9 = 0xffffffffffffffff;
            bVar23 = false;
            while (pSVar2 = (db->splitter).mStream, *(int *)&pSVar2->end != *(int *)&pSVar2->current
                  ) {
              local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
              pcVar3 = (db->splitter).mCur._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1b8,pcVar3,pcVar3 + (db->splitter).mCur._M_string_length);
              if (local_1b8[0]._M_string_length == 0) {
                bVar4 = false;
              }
              else if ((*local_1b8[0]._M_dataplus._M_p == '#') &&
                      (local_1b8[0]._M_string_length != 1)) {
                bVar18 = local_1b8[0]._M_dataplus._M_p[1];
                bVar4 = true;
                if (bVar18 != 0x3d) {
                  sVar16 = 2;
                  do {
                    if ((char)bVar18 < '0') {
                      if (bVar18 != 0x20) goto LAB_0067f705;
                    }
                    else if (0x39 < bVar18) goto LAB_0067f705;
                    if (local_1b8[0]._M_string_length == sVar16) goto LAB_0067f705;
                    bVar18 = local_1b8[0]._M_dataplus._M_p[sVar16];
                    sVar16 = sVar16 + 1;
                  } while (bVar18 != 0x3d);
                }
              }
              else {
LAB_0067f705:
                std::__cxx11::string::_M_append
                          ((char *)&local_228,(ulong)local_1b8[0]._M_dataplus._M_p);
                uVar9 = std::__cxx11::string::find((char)&local_228,0x28);
                bVar23 = uVar9 != 0xffffffffffffffff;
                bVar4 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
                operator_delete(local_1b8[0]._M_dataplus._M_p,
                                local_1b8[0].field_2._M_allocated_capacity + 1);
              }
              if (bVar4) break;
              LineSplitter::operator++(local_208);
            }
            if (bVar23) goto LAB_0067fa75;
            pLVar12 = DefaultLogger::get();
            local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_268,"expected token \'(\'","");
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
            AddLineNumber(local_1b8,&local_268,local_200,&local_248);
            Logger::warn(pLVar12,local_1b8[0]._M_dataplus._M_p);
LAB_00680023:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
              operator_delete(local_1b8[0]._M_dataplus._M_p,
                              local_1b8[0].field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            uVar19 = local_268.field_2._M_allocated_capacity;
            _Var17._M_p = local_268._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
LAB_00680078:
              operator_delete(_Var17._M_p,uVar19 + 1);
            }
          }
          else {
LAB_0067fa75:
            uVar10 = std::__cxx11::string::rfind((char)&local_228,0x29);
            local_1f8 = uVar9;
            if (((uVar10 < uVar9 || uVar10 == 0xffffffffffffffff) || (uVar10 == local_220 - 1)) ||
               (local_228._M_current[uVar10 + 1] != ';')) {
              LineSplitter::operator++(local_208);
              bVar23 = false;
              while (pSVar2 = (db->splitter).mStream,
                    *(int *)&pSVar2->end != *(int *)&pSVar2->current) {
                local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
                pcVar3 = (db->splitter).mCur._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1b8,pcVar3,pcVar3 + (db->splitter).mCur._M_string_length)
                ;
                if (local_1b8[0]._M_string_length == 0) {
LAB_0067fbcc:
                  bVar22 = false;
                }
                else {
                  if ((*local_1b8[0]._M_dataplus._M_p != '#') ||
                     (local_1b8[0]._M_string_length == 1)) {
LAB_0067fb3e:
                    std::__cxx11::string::_M_append
                              ((char *)&local_228,(ulong)local_1b8[0]._M_dataplus._M_p);
                    uVar10 = std::__cxx11::string::rfind((char)&local_228,0x29);
                    if ((uVar10 < local_1f8 || uVar10 == 0xffffffffffffffff) ||
                       (uVar10 == local_220 - 1)) {
                      bVar23 = false;
                    }
                    else {
                      bVar23 = local_228._M_current[uVar10 + 1] == ';';
                    }
                    goto LAB_0067fbcc;
                  }
                  bVar18 = local_1b8[0]._M_dataplus._M_p[1];
                  bVar22 = true;
                  if (bVar18 != 0x3d) {
                    sVar16 = 2;
                    do {
                      if ((char)bVar18 < '0') {
                        if (bVar18 != 0x20) goto LAB_0067fb3e;
                      }
                      else if (0x39 < bVar18) goto LAB_0067fb3e;
                      if (local_1b8[0]._M_string_length == sVar16) goto LAB_0067fb3e;
                      bVar18 = local_1b8[0]._M_dataplus._M_p[sVar16];
                      sVar16 = sVar16 + 1;
                    } while (bVar18 != 0x3d);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
                  operator_delete(local_1b8[0]._M_dataplus._M_p,
                                  local_1b8[0].field_2._M_allocated_capacity + 1);
                }
                if (bVar22) break;
                LineSplitter::operator++(local_208);
              }
              bVar22 = true;
              if (!bVar23) {
                pLVar12 = DefaultLogger::get();
                local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_268,"expected token \')\'","");
                local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
                AddLineNumber(local_1b8,&local_268,local_200,&local_248);
                Logger::warn(pLVar12,local_1b8[0]._M_dataplus._M_p);
                goto LAB_00680023;
              }
            }
            p_Var11 = (db->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var15 = local_1e0;
            if (p_Var11 != (_Base_ptr)0x0) {
              do {
                if (*(ulong *)(p_Var11 + 1) >= local_1f0) {
                  p_Var15 = (_Rb_tree_header *)p_Var11;
                }
                p_Var11 = (&p_Var11->_M_left)[*(ulong *)(p_Var11 + 1) < local_1f0];
              } while (p_Var11 != (_Base_ptr)0x0);
              if ((p_Var15 != local_1e0) && (p_Var15->_M_node_count <= local_1f0)) {
                pLVar12 = DefaultLogger::get();
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b8,"an object with the id #",0x17);
                std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b8," already exists",0xf);
                std::__cxx11::stringbuf::str();
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
                AddLineNumber(&local_268,&local_248,local_200,&local_1d8);
                Logger::warn(pLVar12,local_268._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_dataplus._M_p != &local_268.field_2) {
                  operator_delete(local_268._M_dataplus._M_p,
                                  local_268.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  local_1d8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  local_248.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
                std::ios_base::~ios_base(local_148);
              }
            }
            uVar9 = uVar7 + 1;
            uVar14 = uVar9;
            if (local_220 <= uVar9) {
LAB_006801de:
              std::__throw_out_of_range_fmt
                        ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                         uVar14);
LAB_006801ef:
              __assert_fail("s.length()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/STEPParser/STEPFileReader.cpp"
                            ,0xc0,
                            "void Assimp::STEP::ReadFile(DB &, const EXPRESS::ConversionSchema &, const char *const *, size_t, const char *const *, size_t)"
                           );
            }
            _Var17._M_p = (pointer)(~uVar7 + local_1f8);
            while ((local_228._M_current[uVar9] == ' ' ||
                   (uVar7 = local_1f8, local_228._M_current[uVar9] == '\t'))) {
              uVar9 = uVar9 + 1;
              _Var17._M_p = _Var17._M_p + -1;
              uVar14 = local_220;
              if (uVar9 == local_220) goto LAB_006801de;
            }
            while( true ) {
              uVar7 = uVar7 - 1;
              if (local_220 <= uVar7) {
                std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
                uVar14 = extraout_RDX;
                goto LAB_006801de;
              }
              if ((local_228._M_current[uVar7] != ' ') && (local_228._M_current[uVar7] != '\t'))
              break;
              _Var17._M_p = _Var17._M_p + -1;
            }
            std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_228);
            if (local_1b8[0]._M_string_length != 0) {
              sVar16 = 0;
              do {
                cVar1 = local_1b8[0]._M_dataplus._M_p[sVar16];
                cVar20 = cVar1 + ' ';
                if (0x19 < (byte)(cVar1 + 0xbfU)) {
                  cVar20 = cVar1;
                }
                local_1b8[0]._M_dataplus._M_p[sVar16] = cVar20;
                sVar16 = sVar16 + 1;
                _Var17._M_p = local_1b8[0]._M_dataplus._M_p;
              } while (local_1b8[0]._M_string_length != sVar16);
            }
            cVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
                     ::find(local_38,local_1b8);
            if ((cVar13._M_node != local_40) &&
               (type_00 = *(char **)(cVar13._M_node + 1), type_00 != (char *)0x0)) {
              lVar21 = uVar10 - local_1f8;
              args = (char *)operator_new__(lVar21 + 2);
              if (local_228._M_current + ((uVar10 + 1) - (long)(local_228._M_current + local_1f8))
                  != (char *)0x0) {
                memmove(args,local_228._M_current + local_1f8,
                        (size_t)(local_228._M_current +
                                ((uVar10 + 1) - (long)(local_228._M_current + local_1f8))));
              }
              args[lVar21 + 1] = '\0';
              this = (LazyObject *)operator_new(0x28);
              LazyObject::LazyObject(this,db,local_1f0,(uint64_t)_Var17._M_p,type_00,args);
              DB::InternInsert(db,this);
            }
            if (!bVar22) {
              LineSplitter::operator++(local_208);
            }
            uVar19 = local_1b8[0].field_2._M_allocated_capacity;
            _Var17._M_p = local_1b8[0]._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) goto LAB_00680078;
          }
        }
      }
    }
    else {
      pLVar12 = DefaultLogger::get();
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"expected token \'#\'","");
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
      AddLineNumber(local_1b8,&local_268,local_200,&local_248);
      Logger::warn(pLVar12,local_1b8[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
        operator_delete(local_1b8[0]._M_dataplus._M_p,local_1b8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      LineSplitter::operator++(local_208);
    }
LAB_00680080:
    if ((long *)local_228._M_current != local_218) {
      operator_delete(local_228._M_current,local_218[0] + 1);
    }
  } while (local_1e4 != 0);
  pSVar2 = (db->splitter).mStream;
  iVar5 = (int)pSVar2->end - (int)pSVar2->current;
LAB_006800b4:
  if (iVar5 == 0) {
    pLVar12 = DefaultLogger::get();
    Logger::warn(pLVar12,"STEP: ignoring unexpected EOF");
  }
  bVar22 = DefaultLogger::isNullLogger();
  if (!bVar22) {
    pLVar12 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"STEP: got ",10);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8," object records with ",0x15);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8," inverse index entries",0x16);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar12,local_228._M_current);
    if ((long *)local_228._M_current != local_218) {
      operator_delete(local_228._M_current,local_218[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
    std::ios_base::~ios_base(local_148);
  }
  return;
}

Assistant:

void STEP::ReadFile(DB& db,const EXPRESS::ConversionSchema& scheme,
    const char* const* types_to_track, size_t len,
    const char* const* inverse_indices_to_track, size_t len2)
{
    db.SetSchema(scheme);
    db.SetTypesToTrack(types_to_track,len);
    db.SetInverseIndicesToTrack(inverse_indices_to_track,len2);

    const DB::ObjectMap& map = db.GetObjects();
    LineSplitter& splitter = db.GetSplitter();

    while (splitter) {
        bool has_next = false;
        std::string s = *splitter;
        if (s == "ENDSEC;") {
            break;
        }
        s.erase(std::remove(s.begin(), s.end(), ' '), s.end());

        // want one-based line numbers for human readers, so +1
        const uint64_t line = splitter.get_index()+1;
        // LineSplitter already ignores empty lines
        ai_assert(s.length());
        if (s[0] != '#') {
            ASSIMP_LOG_WARN(AddLineNumber("expected token \'#\'",line));
            ++splitter;
            continue;
        }
        // ---
        // extract id, entity class name and argument string,
        // but don't create the actual object yet.
        // ---
        const std::string::size_type n0 = s.find_first_of('=');
        if (n0 == std::string::npos) {
            ASSIMP_LOG_WARN(AddLineNumber("expected token \'=\'",line));
            ++splitter;
            continue;
        }

        const uint64_t id = strtoul10_64(s.substr(1,n0-1).c_str());
        if (!id) {
            ASSIMP_LOG_WARN(AddLineNumber("expected positive, numeric entity id",line));
            ++splitter;
            continue;
        }
        std::string::size_type n1 = s.find_first_of('(',n0);
        if (n1 == std::string::npos) {
            has_next = true;
            bool ok = false;
            for( ++splitter; splitter; ++splitter) {
                const std::string& snext = *splitter;
                if (snext.empty()) {
                    continue;
                }

                // the next line doesn't start an entity, so maybe it is
                // just a continuation  for this line, keep going
                if (!IsEntityDef(snext)) {
                    s.append(snext);
                    n1 = s.find_first_of('(',n0);
                    ok = (n1 != std::string::npos);
                }
                else {
                    break;
                }
            }

            if(!ok) {
                ASSIMP_LOG_WARN(AddLineNumber("expected token \'(\'",line));
                continue;
            }
        }

        std::string::size_type n2 = s.find_last_of(')');
        if (n2 == std::string::npos || n2 < n1 || n2 == s.length() - 1 || s[n2 + 1] != ';') {
            has_next = true;
            bool ok = false;
            for( ++splitter; splitter; ++splitter) {
                const std::string& snext = *splitter;
                if (snext.empty()) {
                    continue;
                }

                // the next line doesn't start an entity, so maybe it is
                // just a continuation  for this line, keep going
                if (!IsEntityDef(snext)) {
                    s.append(snext);
                    n2 = s.find_last_of(')');
                    ok = !(n2 == std::string::npos || n2 < n1 || n2 == s.length() - 1 || s[n2 + 1] != ';');
                } else {
                    break;
                }
            }
            if(!ok) {
                ASSIMP_LOG_WARN(AddLineNumber("expected token \')\'",line));
                continue;
            }
        }

        if (map.find(id) != map.end()) {
            ASSIMP_LOG_WARN(AddLineNumber((Formatter::format(),"an object with the id #",id," already exists"),line));
        }

        std::string::size_type ns = n0;
        do ++ns; while( IsSpace(s.at(ns)));
        std::string::size_type ne = n1;
        do --ne; while( IsSpace(s.at(ne)));
        std::string type = s.substr(ns,ne-ns+1);
        std::transform( type.begin(), type.end(), type.begin(), &Assimp::ToLower<char>  );
        const char* sz = scheme.GetStaticStringForToken(type);
        if(sz) {
            const std::string::size_type szLen = n2-n1+1;
            char* const copysz = new char[szLen+1];
            std::copy(s.c_str()+n1,s.c_str()+n2+1,copysz);
            copysz[szLen] = '\0';
            db.InternInsert(new LazyObject(db,id,line,sz,copysz));
        }
        if(!has_next) {
            ++splitter;
        }
    }

    if (!splitter) {
        ASSIMP_LOG_WARN("STEP: ignoring unexpected EOF");
    }

    if ( !DefaultLogger::isNullLogger()){
        ASSIMP_LOG_DEBUG((Formatter::format(),"STEP: got ",map.size()," object records with ",
            db.GetRefs().size()," inverse index entries"));
    }
}